

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  __type _Var2;
  int iVar3;
  invalid_argument *piVar4;
  long lVar5;
  ostream *poVar6;
  Header *pHVar7;
  long in_RSI;
  int in_EDI;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  exception *e;
  Header h;
  bool in_stack_000001b7;
  Compression in_stack_000001b8;
  LevelRoundingMode in_stack_000001bc;
  LevelMode in_stack_000001c0;
  int in_stack_000001c4;
  char *in_stack_000001c8;
  char *in_stack_000001d0;
  int in_stack_000001e0;
  int in_stack_000001e8;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_000001f0;
  stringstream e_1;
  Extrapolation in_stack_00000200;
  int parts;
  MultiPartInputFile input;
  char *libraryVersion;
  int partnum;
  int i;
  bool verbose;
  Extrapolation extY;
  Extrapolation extX;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  doNotFilter;
  int tileSizeY;
  int tileSizeX;
  Compression compression;
  LevelRoundingMode roundingMode;
  LevelMode mode;
  char *outFile;
  char *inFile;
  undefined4 in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb04;
  int *in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb10;
  undefined4 in_stack_fffffffffffffb14;
  undefined4 in_stack_fffffffffffffb18;
  undefined4 in_stack_fffffffffffffb1c;
  undefined4 in_stack_fffffffffffffb20;
  int in_stack_fffffffffffffb24;
  allocator<char> *in_stack_fffffffffffffb30;
  char *in_stack_fffffffffffffb38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb40;
  undefined8 in_stack_fffffffffffffb60;
  undefined1 verbose_00;
  char *in_stack_fffffffffffffb68;
  ostream *in_stack_fffffffffffffb70;
  Header local_370 [63];
  undefined1 local_331;
  string *in_stack_fffffffffffffcd0;
  stringstream local_310 [16];
  ostream local_300 [380];
  int local_184;
  MultiPartInputFile local_180 [32];
  char *local_160;
  allocator<char> local_151;
  string local_150 [39];
  allocator<char> local_129;
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [32];
  _Base_ptr local_e0;
  undefined1 local_d8;
  allocator<char> local_c9;
  string local_c8 [32];
  int local_a8;
  int local_a4;
  undefined4 local_a0;
  undefined1 local_89;
  Extrapolation local_88;
  Extrapolation local_84;
  int local_4c;
  int local_48;
  Compression local_44;
  undefined4 local_40;
  undefined4 local_3c;
  char *local_38;
  char *local_30;
  long local_28;
  int local_20;
  int local_1c;
  
  local_1c = 0;
  local_30 = (char *)0x0;
  local_38 = (char *)0x0;
  local_3c = 0;
  local_40 = 0;
  local_44 = ZIP_COMPRESSION;
  local_48 = 0x40;
  local_4c = 0x40;
  local_28 = in_RSI;
  local_20 = in_EDI;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)0x108771);
  local_84 = CLAMP;
  local_88 = CLAMP;
  local_89 = 0;
  if (local_20 < 2) {
    anon_unknown.dwarf_d436::usageMessage
              (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
               SUB81((ulong)in_stack_fffffffffffffb60 >> 0x38,0));
    local_1c = -1;
  }
  else {
    local_a4 = 1;
    local_a8 = 0;
    while (local_a4 < local_20) {
      iVar3 = strcmp(*(char **)(local_28 + (long)local_a4 * 8),"-o");
      if (iVar3 == 0) {
        local_3c = 0;
        local_a4 = local_a4 + 1;
      }
      else {
        iVar3 = strcmp(*(char **)(local_28 + (long)local_a4 * 8),"-m");
        if (iVar3 == 0) {
          local_3c = 1;
          local_a4 = local_a4 + 1;
        }
        else {
          iVar3 = strcmp(*(char **)(local_28 + (long)local_a4 * 8),"-r");
          if (iVar3 == 0) {
            local_3c = 2;
            local_a4 = local_a4 + 1;
          }
          else {
            iVar3 = strcmp(*(char **)(local_28 + (long)local_a4 * 8),"-f");
            if (iVar3 == 0) {
              if (local_20 + -2 < local_a4) {
                piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
                std::invalid_argument::invalid_argument
                          (piVar4,"missing filter value with -f option");
                __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                            std::invalid_argument::~invalid_argument);
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
                         in_stack_fffffffffffffb30);
              pVar8 = std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                               (value_type *)
                               CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
              local_e0 = (_Base_ptr)pVar8.first._M_node;
              local_d8 = pVar8.second;
              std::__cxx11::string::~string(local_c8);
              std::allocator<char>::~allocator(&local_c9);
              local_a4 = local_a4 + 2;
            }
            else {
              iVar3 = strcmp(*(char **)(local_28 + (long)local_a4 * 8),"-e");
              if (iVar3 == 0) {
                if (local_20 + -3 < local_a4) {
                  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
                  std::invalid_argument::invalid_argument
                            (piVar4,"missing extrapolation values with -e option");
                  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                              std::invalid_argument::~invalid_argument);
                }
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
                           in_stack_fffffffffffffb30);
                local_84 = anon_unknown.dwarf_d436::getExtrapolation(in_stack_fffffffffffffcd0);
                std::__cxx11::string::~string(local_100);
                std::allocator<char>::~allocator(&local_101);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
                           in_stack_fffffffffffffb30);
                local_88 = anon_unknown.dwarf_d436::getExtrapolation(in_stack_fffffffffffffcd0);
                std::__cxx11::string::~string(local_128);
                std::allocator<char>::~allocator(&local_129);
                local_a4 = local_a4 + 3;
              }
              else {
                iVar3 = strcmp(*(char **)(local_28 + (long)local_a4 * 8),"-t");
                if (iVar3 == 0) {
                  if (local_20 + -3 < local_a4) {
                    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
                    std::invalid_argument::invalid_argument
                              (piVar4,"missing tile size with -t option");
                    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                                std::invalid_argument::~invalid_argument);
                  }
                  lVar5 = strtol(*(char **)(local_28 + (long)(local_a4 + 1) * 8),(char **)0x0,0);
                  local_48 = (int)lVar5;
                  lVar5 = strtol(*(char **)(local_28 + (long)(local_a4 + 2) * 8),(char **)0x0,0);
                  local_4c = (int)lVar5;
                  if ((local_48 < 1) || (local_4c < 1)) {
                    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
                    std::invalid_argument::invalid_argument
                              (piVar4,"Tile size must be greater than zero");
                    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                                std::invalid_argument::~invalid_argument);
                  }
                  local_a4 = local_a4 + 3;
                }
                else {
                  iVar3 = strcmp(*(char **)(local_28 + (long)local_a4 * 8),"-d");
                  if (iVar3 == 0) {
                    local_40 = 0;
                    local_a4 = local_a4 + 1;
                  }
                  else {
                    iVar3 = strcmp(*(char **)(local_28 + (long)local_a4 * 8),"-u");
                    if (iVar3 == 0) {
                      local_40 = 1;
                      local_a4 = local_a4 + 1;
                    }
                    else {
                      iVar3 = strcmp(*(char **)(local_28 + (long)local_a4 * 8),"-z");
                      if (iVar3 == 0) {
                        if (local_20 + -2 < local_a4) {
                          piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
                          std::invalid_argument::invalid_argument
                                    (piVar4,"Missing compression value with -z option");
                          __cxa_throw(piVar4,&std::invalid_argument::typeinfo,
                                      std::invalid_argument::~invalid_argument);
                        }
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  (in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,
                                   in_stack_fffffffffffffb30);
                        local_44 = anon_unknown.dwarf_d436::getCompression
                                             (in_stack_fffffffffffffcd0);
                        std::__cxx11::string::~string(local_150);
                        std::allocator<char>::~allocator(&local_151);
                        local_a4 = local_a4 + 2;
                      }
                      else {
                        iVar3 = strcmp(*(char **)(local_28 + (long)local_a4 * 8),"-v");
                        if (iVar3 == 0) {
                          local_89 = 1;
                          local_a4 = local_a4 + 1;
                        }
                        else {
                          iVar3 = strcmp(*(char **)(local_28 + (long)local_a4 * 8),"-p");
                          if (iVar3 == 0) {
                            anon_unknown.dwarf_d436::getPartNum
                                      (in_stack_fffffffffffffb24,
                                       (char **)CONCAT44(in_stack_fffffffffffffb1c,
                                                         in_stack_fffffffffffffb18),
                                       (int *)CONCAT44(in_stack_fffffffffffffb14,
                                                       in_stack_fffffffffffffb10),
                                       in_stack_fffffffffffffb08);
                          }
                          else {
                            iVar3 = strcmp(*(char **)(local_28 + (long)local_a4 * 8),"-h");
                            verbose_00 = (undefined1)((ulong)in_stack_fffffffffffffb60 >> 0x38);
                            if (iVar3 == 0) {
LAB_001091c0:
                              anon_unknown.dwarf_d436::usageMessage
                                        (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                                         (bool)verbose_00);
                              local_1c = 0;
                              goto LAB_001099c5;
                            }
                            iVar3 = strcmp(*(char **)(local_28 + (long)local_a4 * 8),"--help");
                            verbose_00 = (undefined1)((ulong)in_stack_fffffffffffffb60 >> 0x38);
                            if (iVar3 == 0) goto LAB_001091c0;
                            iVar3 = strcmp(*(char **)(local_28 + (long)local_a4 * 8),"--version");
                            if (iVar3 == 0) {
                              local_160 = (char *)Imf_3_4::getLibraryVersion();
                              poVar6 = std::operator<<((ostream *)&std::cout,
                                                       "exrmaketiled (OpenEXR) ");
                              std::operator<<(poVar6,"3.4.0");
                              iVar3 = strcmp(local_160,"3.4.0");
                              if (iVar3 != 0) {
                                poVar6 = std::operator<<((ostream *)&std::cout,"(OpenEXR version ");
                                poVar6 = std::operator<<(poVar6,local_160);
                                std::operator<<(poVar6,")");
                              }
                              poVar6 = std::operator<<((ostream *)&std::cout," https://openexr.com")
                              ;
                              std::ostream::operator<<
                                        (poVar6,std::endl<char,std::char_traits<char>>);
                              poVar6 = std::operator<<((ostream *)&std::cout,
                                                                                                              
                                                  "Copyright (c) Contributors to the OpenEXR Project"
                                                  );
                              std::ostream::operator<<
                                        (poVar6,std::endl<char,std::char_traits<char>>);
                              poVar6 = std::operator<<((ostream *)&std::cout,"License BSD-3-Clause")
                              ;
                              std::ostream::operator<<
                                        (poVar6,std::endl<char,std::char_traits<char>>);
                              local_1c = 0;
                              goto LAB_001099c5;
                            }
                            if (local_30 == (char *)0x0) {
                              local_30 = *(char **)(local_28 + (long)local_a4 * 8);
                            }
                            else {
                              local_38 = *(char **)(local_28 + (long)local_a4 * 8);
                            }
                            local_a4 = local_a4 + 1;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    if ((local_30 != (char *)0x0) && (local_38 != (char *)0x0)) {
      iVar3 = strcmp(local_30,local_38);
      pcVar1 = local_30;
      if (iVar3 == 0) {
        piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar4,"Input and output cannot be the same file");
        __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      iVar3 = Imf_3_4::globalThreadCount();
      Imf_3_4::MultiPartInputFile::MultiPartInputFile(local_180,pcVar1,iVar3,true);
      local_184 = Imf_3_4::MultiPartInputFile::parts();
      if ((local_a8 < 0) || (local_184 <= local_a8)) {
        std::__cxx11::stringstream::stringstream(local_310);
        poVar6 = std::operator<<(local_300,"You asked for part ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_a8);
        poVar6 = std::operator<<(poVar6," in ");
        poVar6 = std::operator<<(poVar6,local_30);
        poVar6 = std::operator<<(poVar6,", which only has ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_184);
        std::operator<<(poVar6," parts");
        local_331 = 1;
        piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringstream::str();
        std::invalid_argument::invalid_argument(piVar4,(string *)&stack0xfffffffffffffcd0);
        local_331 = 0;
        __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument
                   );
      }
      pHVar7 = (Header *)Imf_3_4::MultiPartInputFile::header((int)local_180);
      Imf_3_4::Header::Header(local_370,pHVar7);
      Imf_3_4::Header::type_abi_cxx11_();
      _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
      if (!_Var2) {
        Imf_3_4::Header::type_abi_cxx11_();
        _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffb24,in_stack_fffffffffffffb20),
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
        if (!_Var2) {
          Imf_3_4::Header::~Header(local_370);
          Imf_3_4::MultiPartInputFile::~MultiPartInputFile
                    ((MultiPartInputFile *)
                     CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
          makeTiled(in_stack_000001d0,in_stack_000001c8,in_stack_000001c4,in_stack_000001c0,
                    in_stack_000001bc,in_stack_000001b8,in_stack_000001e0,in_stack_000001e8,
                    in_stack_000001f0,_e_1,in_stack_00000200,in_stack_000001b7);
          local_1c = 0;
          goto LAB_001099c5;
        }
      }
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(piVar4,"Cannot make tile for deep data");
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    anon_unknown.dwarf_d436::usageMessage
              (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
               SUB81((ulong)in_stack_fffffffffffffb60 >> 0x38,0));
    local_1c = -1;
  }
LAB_001099c5:
  local_a0 = 1;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)0x1099d2);
  return local_1c;
}

Assistant:

int
main (int argc, char** argv)
{
    const char*       inFile       = 0;
    const char*       outFile      = 0;
    LevelMode         mode         = ONE_LEVEL;
    LevelRoundingMode roundingMode = ROUND_DOWN;
    Compression       compression  = ZIP_COMPRESSION;
    int               tileSizeX    = 64;
    int               tileSizeY    = 64;
    set<string>       doNotFilter;
    Extrapolation     extX    = CLAMP;
    Extrapolation     extY    = CLAMP;
    bool              verbose = false;

    //
    // Parse the command line.
    //

    if (argc < 2)
    {
        usageMessage (cerr, argv[0], false);
        return -1;
    }

    try
    {
        int i       = 1;
        int partnum = 0;

        while (i < argc)
        {
            if (!strcmp (argv[i], "-o"))
            {
                //
                // generate a ONE_LEVEL image
                //

                mode = ONE_LEVEL;
                i += 1;
            }
            else if (!strcmp (argv[i], "-m"))
            {
                //
                // Generate a MIPMAP_LEVELS image
                //

                mode = MIPMAP_LEVELS;
                i += 1;
            }
            else if (!strcmp (argv[i], "-r"))
            {
                //
                // Generate a RIPMAP_LEVELS image
                //

                mode = RIPMAP_LEVELS;
                i += 1;
            }
            else if (!strcmp (argv[i], "-f"))
            {
                //
                // Don't low-pass filter the specified image channel
                //

                if (i > argc - 2)
                    throw invalid_argument (
                        "missing filter value with -f option");

                doNotFilter.insert (argv[i + 1]);
                i += 2;
            }
            else if (!strcmp (argv[i], "-e"))
            {
                //
                // Set x and y extrapolation method
                //

                if (i > argc - 3)
                    throw invalid_argument (
                        "missing extrapolation values with -e option");

                extX = getExtrapolation (argv[i + 1]);
                extY = getExtrapolation (argv[i + 2]);
                i += 3;
            }
            else if (!strcmp (argv[i], "-t"))
            {
                //
                // Set tile size
                //

                if (i > argc - 3)
                    throw invalid_argument ("missing tile size with -t option");

                tileSizeX = strtol (argv[i + 1], 0, 0);
                tileSizeY = strtol (argv[i + 2], 0, 0);

                if (tileSizeX <= 0 || tileSizeY <= 0)
                    throw invalid_argument (
                        "Tile size must be greater than zero");

                i += 3;
            }
            else if (!strcmp (argv[i], "-d"))
            {
                //
                // Round down
                //

                roundingMode = ROUND_DOWN;
                i += 1;
            }
            else if (!strcmp (argv[i], "-u"))
            {
                //
                // Round down
                //

                roundingMode = ROUND_UP;
                i += 1;
            }
            else if (!strcmp (argv[i], "-z"))
            {
                //
                // Set compression method
                //

                if (i > argc - 2)
                    throw invalid_argument (
                        "Missing compression value with -z option");

                compression = getCompression (argv[i + 1]);
                i += 2;
            }
            else if (!strcmp (argv[i], "-v"))
            {
                //
                // Verbose mode
                //

                verbose = true;
                i += 1;
            }
            else if (!strcmp (argv[i], "-p"))
            {
                getPartNum (argc, argv, i, &partnum);
            }
            else if (!strcmp (argv[i], "-h") || !strcmp (argv[i], "--help"))
            {
                //
                // Print help message
                //

                usageMessage (cout, "exrmaketiled", true);
                return 0;
            }
            else if (!strcmp (argv[i], "--version"))
            {
                const char* libraryVersion = getLibraryVersion ();

                cout << "exrmaketiled (OpenEXR) " << OPENEXR_VERSION_STRING;
                if (strcmp (libraryVersion, OPENEXR_VERSION_STRING))
                    cout << "(OpenEXR version " << libraryVersion << ")";
                cout << " https://openexr.com" << endl;
                cout << "Copyright (c) Contributors to the OpenEXR Project"
                     << endl;
                cout << "License BSD-3-Clause" << endl;
                return 0;
            }
            else
            {
                //
                // Image file name
                //

                if (inFile == 0)
                    inFile = argv[i];
                else
                    outFile = argv[i];

                i += 1;
            }
        }

        if (inFile == 0 || outFile == 0)
        {
            usageMessage (cerr, argv[0], false);
            return -1;
        }

        if (!strcmp (inFile, outFile))
            throw invalid_argument ("Input and output cannot be the same file");

        //
        // Load inFile, and save a tiled version in outFile.
        //

        //
        // check input
        //
        {
            MultiPartInputFile input (inFile);
            int                parts = input.parts ();

            if (partnum < 0 || partnum >= parts)
            {
                std::stringstream e;
                e << "You asked for part " << partnum << " in " << inFile
                  << ", which only has " << parts << " parts";
                throw invalid_argument (e.str ());
            }

            Header h = input.header (partnum);
            if (h.type () == DEEPTILE || h.type () == DEEPSCANLINE)
                throw invalid_argument ("Cannot make tile for deep data");
        }

        makeTiled (
            inFile,
            outFile,
            partnum,
            mode,
            roundingMode,
            compression,
            tileSizeX,
            tileSizeY,
            doNotFilter,
            extX,
            extY,
            verbose);
    }
    catch (const exception& e)
    {
        cerr << argv[0] << ": " << e.what () << endl;
        return 1;
    }

    return 0;
}